

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_JunitOutputEnabled_Test::testBody
          (TEST_CommandLineTestRunner_JunitOutputEnabled_Test *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  TEST_CommandLineTestRunner_JunitOutputEnabled_Test *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,2,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(commandLineTestRunner.super_CommandLineTestRunner.registry_ !=
                           (TestRegistry *)0x0),"CHECK",
             "commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ != NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,200,pTVar2);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(CommandLineTestRunner, JunitOutputEnabled)
{
    const char* argv[] = { "tests.exe", "-ojunit"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    CHECK(commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ != NULLPTR);
}